

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldsout.c
# Opt level: O2

uint sysout_loader(char *sysout_file_name,uint sys_size)

{
  void *__buf;
  int iVar1;
  int iVar2;
  __off_t _Var3;
  ssize_t sVar4;
  DLword *pDVar5;
  uint *__buf_00;
  uint uVar6;
  uint uVar7;
  uint *puVar8;
  char *pcVar9;
  ulong uVar10;
  uint uVar11;
  int j;
  ulong __offset;
  ulong local_208;
  IFPAGE ifpage;
  stat stat_buf;
  
  if (sys_size - 1 < 7) {
    pcVar9 = "You have to specify more than 8MB for process size";
LAB_001240ef:
    perror(pcVar9);
  }
  else {
    if (0x100 < sys_size) {
      pcVar9 = "256Mb is the maximum legal sysout size.";
      goto LAB_001240ef;
    }
    iVar1 = open(sysout_file_name,0);
    if (iVar1 == -1) {
      pcVar9 = (char *)&stat_buf;
      sprintf(pcVar9,"sysout_loader: can\'t open sysout file: %s",sysout_file_name);
      goto LAB_001240ef;
    }
    _Var3 = lseek(iVar1,0x200,0);
    if (_Var3 == -1) {
      pcVar9 = "sysout_loader: can\'t seek to IFPAGE";
      goto LAB_001240ef;
    }
    sVar4 = read(iVar1,&ifpage,0xb0);
    if (sVar4 == -1) {
      pcVar9 = "sysout_loader: can\'t read IFPAGE";
      goto LAB_001240ef;
    }
    word_swap_page(&ifpage,0x2c);
    uVar7 = 0x40;
    if (ifpage.process_size != 0) {
      uVar7 = ifpage.process_size;
    }
    if (sys_size != 0) {
      uVar7 = sys_size;
    }
    if ((ushort)(ifpage.storagefullstate - 3) < 2) {
      iVar2 = 0;
      if (ifpage.process_size == uVar7) goto LAB_00123da8;
      sprintf((char *)&stat_buf,
              "\nsysout loader: Error, secondary space in use. You can\'t specify size.\nProcess size = %d\nSys size = %d\n"
              ,(ulong)ifpage.process_size,(ulong)uVar7);
      fwrite("sysout_loader: You can\'t specify the process size.\n",0x33,1,_stderr);
      fwrite("Because, secondary space is already used.\n",0x2a,1,_stderr);
      fprintf(_stderr,"(size is %d, you specified %d.)\n",(ulong)ifpage.process_size,(ulong)uVar7);
    }
    else {
      iVar2 = 1;
LAB_00123da8:
      Storage_expanded = iVar2;
      pDVar5 = (DLword *)mmap((void *)0x0,(ulong)(uVar7 << 0x14),3,0x22,-1,0);
      if (pDVar5 == (DLword *)0xffffffffffffffff) {
        fprintf(_stderr,"sysout_loader: can\'t allocate Lisp %dMBytes VM \n",(ulong)uVar7);
      }
      else {
        Lisp_world = pDVar5;
        iVar2 = fstat(iVar1,(stat *)&stat_buf);
        if (iVar2 == -1) {
          pcVar9 = "sysout_loader: can\'t get sysout file size";
          goto LAB_001240ef;
        }
        if (ifpage.key != 0x15e3) {
          printf("sysout_loader: %s isn\'t a sysout:\nkey is %x, should be %x\n",sysout_file_name,
                 (ulong)ifpage.key,0x15e3);
          iVar1 = 1;
          goto LAB_0012402c;
        }
        if ((stat_buf.st_size & 0x1ffU) != 0) {
          printf("CAUTION::not an integral number of pages.  sysout & 0x1ff = 0x%x\n");
        }
        uVar11 = (uint)(stat_buf.st_size / 0x200);
        if (ifpage.nactivepages != (uVar11 & 0x7fffffff)) {
          printf("sysout_loader:IFPAGE says sysout size is %d\n",(ulong)(uint)ifpage.nactivepages);
          printf("But, sysout size from UNIX is %d\n",(ulong)(uVar11 & 0x7fffffff));
          goto LAB_0012402a;
        }
        _Var3 = lseek(iVar1,(ulong)ifpage.fptovpstart * 0x200 + -0x1fc,0);
        if (_Var3 == -1) {
          pcVar9 = "sysout_loader: can\'t seek to FPTOVP";
          goto LAB_001240ef;
        }
        __buf_00 = (uint *)malloc((ulong)(uVar11 * 4 + 4));
        sVar4 = read(iVar1,__buf_00,(ulong)(uVar11 << 2));
        if (sVar4 == -1) {
          pcVar9 = "sysout_loader: can\'t read FPTOVP";
LAB_0012401d:
          perror(pcVar9);
        }
        else {
          word_swap_page(__buf_00,ifpage.nactivepages + 1);
          init_display2(Lisp_world + 0x120000,0x200000);
          local_208 = 0xffffffffffffffff;
          uVar10 = 0;
          uVar11 = 0;
          puVar8 = __buf_00;
          while( true ) {
            if ((ulong)(uint)ifpage.nactivepages << 9 == uVar10) {
              free(__buf_00);
              flush_display_buffer();
              close(iVar1);
              return uVar7;
            }
            uVar6 = *puVar8;
            if (uVar6 < 0xffff0000) break;
LAB_00123f80:
            uVar11 = uVar11 + 1;
            uVar10 = uVar10 + 0x200;
            puVar8 = puVar8 + 1;
          }
          __offset = uVar10 & 0xffffffff;
          if (local_208 != __offset) {
            _Var3 = lseek(iVar1,__offset,0);
            if (_Var3 == -1) {
              pcVar9 = "sysout_loader: can\'t seek sysout file";
              goto LAB_0012401d;
            }
            uVar6 = *puVar8;
            local_208 = __offset;
          }
          __buf = (void *)((long)pDVar5 + (ulong)(uVar6 << 9));
          sVar4 = read(iVar1,__buf,0x200);
          if (sVar4 != -1) {
            local_208 = local_208 + 0x200;
            word_swap_page(__buf,0x80);
            goto LAB_00123f80;
          }
          printf("sysout_loader: can\'t read sysout file at %d\n",(ulong)uVar11);
          printf("               offset was 0x%zx (0x%x pages).\n",(ulong)(uVar6 << 9),
                 (ulong)*puVar8);
          perror("read() error was");
          for (uVar10 = 0; uVar10 != 10; uVar10 = uVar10 + 1) {
            printf(" %d: 0x%x  ",uVar10 & 0xffffffff,(ulong)__buf_00[uVar10]);
          }
        }
        free(__buf_00);
      }
    }
  }
LAB_0012402a:
  iVar1 = -1;
LAB_0012402c:
  exit(iVar1);
}

Assistant:

unsigned sysout_loader(const char *sysout_file_name, unsigned sys_size) {
  int sysout; /* SysoutFile descriptor */

  IFPAGE ifpage; /* IFPAGE */

#ifdef BIGVM
  /* 1 "cell" per page for 256MB in 512 byte pages */
  unsigned int *fptovp;
#else
  DLword *fptovp; /* FPTOVP */
#endif                /* BIGVM */
  off_t fptovp_offset; /* FPTOVP start offset */

  char *lispworld_scratch; /* scratch area for lispworld */
  size_t lispworld_offset;   /* lispworld offset */

  unsigned sysout_size; /* sysout size in page */
  struct stat stat_buf; /* file stat buf */

  char errmsg[255];
  off_t cfp = -1;  /* tracks current file position in sysout, or -1 */

  /* Checks for specifying the process size (phase I) */
  /* If sys_size == 0 figure out the proper size later */
  if ((sys_size != 0) && (sys_size < DEFAULT_PRIME_SYSOUTSIZE)) {
    perror("You have to specify more than 8MB for process size");
    exit(-1);
  } else if (sys_size > MAX_EXPLICIT_SYSOUTSIZE) {
    perror("256Mb is the maximum legal sysout size.");
    exit(-1);
  }

  /*
   * first read the IFPAGE(InterfacePage)
   */

  /* open SysoutFile */
  sysout = open(sysout_file_name, O_RDONLY);
  if (sysout == -1) {
    sprintf(errmsg, "sysout_loader: can't open sysout file: %s", sysout_file_name);
    perror(errmsg);
    exit(-1);
  }

  /* seek to IFPAGE */
  if (lseek(sysout, IFPAGE_ADDRESS, SEEK_SET) == -1) {
    perror("sysout_loader: can't seek to IFPAGE");
    exit(-1);
  }

  /* reads IFPAGE into scratch_page */
  if (read(sysout, &ifpage, sizeof(IFPAGE)) == -1) {
    perror("sysout_loader: can't read IFPAGE");
    exit(-1);
  }

#ifdef BYTESWAP
  word_swap_page((unsigned short *)&ifpage, (3 + sizeof(IFPAGE)) / 4);
#endif

/* Check the sysout and emulator for compatibility:
       The sysout's ifpage.lversion must be >= LVERSION, and
       the sysout's ifpage.minbversion must be <= MINBVERSION
*/
#ifndef NOVERSION
  if (ifpage.lversion < LVERSION) {
    (void)fprintf(stderr, "Lisp VM is too old for this emulator.\n");
    (void)fprintf(stderr, "(version is %d, must be at least %d.)\n", ifpage.lversion, LVERSION);
    exit(-1);
  }

  if (ifpage.minbversion > MINBVERSION) {
    (void)fprintf(stderr, "Emulator is too old for this Lisp VM.\n");
    (void)fprintf(stderr, "(version is %d, must be at least %d.)\n", MINBVERSION, ifpage.minbversion);
    exit(-1);
  }
#endif /* NOVERSION */

  /* use default or the previous one */
  if (sys_size == 0) {
    if (ifpage.process_size == 0)        /* Pure LISP.SYSOUT */
      sys_size = DEFAULT_MAX_SYSOUTSIZE; /* default for pure SYSOUT */
    else
      sys_size = ifpage.process_size; /* use previous one */
  }

  /* Checks for specifying the process size (phase II) */
  if ((ifpage.storagefullstate == SFS_ARRAYSWITCHED) ||
      (ifpage.storagefullstate == SFS_FULLYSWITCHED)) {
    /* Storage may be allocated from Secondary space */
    /* Therefore you can not change \\DefaultSecondMDSPage */
    if (ifpage.process_size != sys_size) {
      char tmp[200];
      sprintf(tmp,
              "\nsysout loader: Error, secondary space in use. You can't specify size.\nProcess "
              "size = %d\nSys size = %d\n",
              ifpage.process_size, sys_size);
#ifdef DOS
      /* Note that we have an initialized display by now. */
      /* Hence we have to observe the display protocol. */
      VESA_errorexit(tmp);
#else
      (void)fprintf(stderr, "sysout_loader: You can't specify the process size.\n");
      (void)fprintf(stderr, "Because, secondary space is already used.\n");
      (void)fprintf(stderr, "(size is %d, you specified %d.)\n", ifpage.process_size, sys_size);
      exit(-1);
#endif /* DOS */
    }
    /*Can use this sys_size as the process size */
    /* The sys_size should be same as the previous one */
    Storage_expanded = NIL;
  } else { /* assumes that we can expand the process space */
    Storage_expanded = T;
    /* You can use secondary space , though it was STORAGEFULL
       So, STORAGEFULL may be set to NIL later  */
  }

  /* allocate Virtual Memory Space */

  lispworld_scratch = mmap(0, sys_size * MBYTE, PROT_READ|PROT_WRITE, MAP_ANON | MAP_PRIVATE, -1, 0);
  if (lispworld_scratch == MAP_FAILED) {
    (void)fprintf(stderr, "sysout_loader: can't allocate Lisp %dMBytes VM \n", sys_size);
    exit(-1);
  }

  /* now you can access lispworld */
  Lisp_world = (DLword *)lispworld_scratch;

  DBPRINT(("VM allocated = 0x%x at %p\n", sys_size * MBYTE, (void *)Lisp_world));
  DBPRINT(("Native Load Address = 0x%x\n", native_load_address));

  /*
   * get FPTOVP location and SysoutFile size
   */

  /* get FPTOVP location from IFPAGE */
  fptovp_offset = ifpage.fptovpstart;

  DBPRINT(("FPTOVP Location %ld \n", (long)fptovp_offset));

  /* get sysout file size in halfpage(256) */
  if (fstat(sysout, &stat_buf) == -1) {
    perror("sysout_loader: can't get sysout file size");
    exit(-1);
  }
  sysout_size = (unsigned)(stat_buf.st_size / BYTESPER_PAGE * 2);

  DBPRINT(("sysout size / 2 = 0x%x\n", sysout_size / 2));
  DBPRINT(("vmem size = 0x%x\n", ifpage.nactivepages));

  /* do some simple checks to see if this is really a sysout */
  if (ifpage.key != IFPAGE_KEYVAL) {
    printf("sysout_loader: %s isn't a sysout:\nkey is %x, should be %x\n", sysout_file_name,
           ifpage.key, IFPAGE_KEYVAL);
    exit(1);
  }

  if ((stat_buf.st_size & (BYTESPER_PAGE - 1)) != 0)
    printf("CAUTION::not an integral number of pages.  sysout & 0x1ff = 0x%x\n",
           (int)(stat_buf.st_size & (BYTESPER_PAGE - 1)));

  if (ifpage.nactivepages != (sysout_size / 2)) {
    printf("sysout_loader:IFPAGE says sysout size is %d\n", ifpage.nactivepages);
    printf("But, sysout size from UNIX is %d\n", sysout_size / 2);
    exit(-1);
  }

/*
 * Now get FPTOVP
 */

/* seek to FPTOVP */
#ifdef BIGVM
  fptovp_offset = (fptovp_offset - 1) * BYTESPER_PAGE + 4;
#else
  fptovp_offset = (fptovp_offset - 1) * BYTESPER_PAGE + 2;
#endif
  if (lseek(sysout, fptovp_offset, SEEK_SET) == -1) {
    perror("sysout_loader: can't seek to FPTOVP");
    exit(-1);
  }

  /* read FPTOVP */

#ifdef BIGVM
  /* fptovp is now in cells, not words */
  fptovp = malloc(sysout_size * 2 + 4);
  if (read(sysout, fptovp, sysout_size * 2) == -1) {
    perror("sysout_loader: can't read FPTOVP");
    free(fptovp);
    exit(-1);
  }

#ifdef BYTESWAP
  /* So space to swap is twice as big, too. */
  word_swap_page((unsigned short *)fptovp, (sysout_size / 2) + 1);
#endif /* BYTESWAP */

#else

  fptovp = malloc(sysout_size + 2);
  if (read(sysout, fptovp, sysout_size) == -1) {
    perror("sysout_loader: can't read FPTOVP");
    free(fptovp);
    exit(-1);
  }

#ifdef BYTESWAP
  word_swap_page((unsigned short *)fptovp, (sysout_size / 4) + 1);
#endif /* BYTESWAP */

#endif /* BIGVM */

  /*
   * Initialize the display (note now passing 68k address!!!)
   */
  init_display2(NativeAligned2FromLAddr(DISPLAY_OFFSET), 65536 * 16 * 2);

  /* read sysout file to lispworld */

  for (unsigned i = 0; i < (sysout_size / 2); i++) {
#ifdef DOS
    /* Dial that floats from left to right on the top line of the */
    /* displaty. Dial shows % of sysout loaded by digits and */
    /* position. */
    int columns;
    switch (currentdsp->graphicsmode) {
      case 0x104:
        columns = 120; /* 131 - 10 */
        break;
      case 0x102:
        columns = 69; /* 79 - 10 */
        break;
      default:
        columns = 69; /* 79 - 10 */
        break;
    }
    _settextposition((short)0, (short)0);
    if ((i & 0xf) == 0) {
      for (int j = 0; j < (columns * i) / (sysout_size >> 1); j++) putchar(' ');
      printf("-=(%2d%%)=-\n", (100 * i) / (sysout_size >> 1));
    }
#endif /* DOS */
    if (GETPAGEOK(fptovp, i) != 0177777) {
      /* only seek if not already at desired position */
      if (i * BYTESPER_PAGE != cfp) {
	if (lseek(sysout, i * BYTESPER_PAGE, SEEK_SET) == -1) {
	  perror("sysout_loader: can't seek sysout file");
	  free(fptovp);
	  exit(-1);
	}
	cfp = i * BYTESPER_PAGE; /* now at known position */
      }
      lispworld_offset = GETFPTOVP(fptovp, i) * BYTESPER_PAGE;
      if (read(sysout, lispworld_scratch + lispworld_offset, BYTESPER_PAGE) == -1) {
        printf("sysout_loader: can't read sysout file at %d\n", i);
        printf("               offset was 0x%zx (0x%x pages).\n", lispworld_offset,
               GETFPTOVP(fptovp, i));
        perror("read() error was");
        for (int j = 0; j < 10; j++) {
          printf(" %d: 0x%x  ", j, GETFPTOVP(fptovp, j));
        }
        free(fptovp);
        exit(-1);
      }
      cfp += BYTESPER_PAGE; /* new known position */
#ifdef BYTESWAP
      word_swap_page((DLword *)(lispworld_scratch + lispworld_offset), 128);
#endif
    }
  }
  free(fptovp);
  DBPRINT(("sysout file is read completely.\n"));

#if (defined(DISPLAYBUFFER) || defined(XWINDOW) || defined(DOS))
  TPRINT(("Flushing display buffer...\n"));
  flush_display_buffer();
  TPRINT(("After Flushing display buffer\n"));
#endif /* DISPLAYBUFFER || XWINDOW || DOS */

  close(sysout);
  return (sys_size);
}